

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.cpp
# Opt level: O3

string * duckdb::TestDirectoryPath_abi_cxx11_(void)

{
  uint __val;
  uint uVar1;
  char cVar2;
  uint uVar3;
  pointer pFVar4;
  uint uVar5;
  ulong uVar6;
  pointer *__ptr;
  string *in_RDI;
  uint __len;
  string __str;
  string test_directory;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  duckdb::FileSystem::CreateLocal();
  GetTestDirectory_abi_cxx11_();
  pFVar4 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator->
                     ((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                       *)&local_98);
  cVar2 = (**(code **)(*(long *)pFVar4 + 0x68))(pFVar4,local_70,0);
  if (cVar2 == '\0') {
    pFVar4 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator->((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                         *)&local_98);
    (**(code **)(*(long *)pFVar4 + 0x70))(pFVar4,local_70,0);
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  if (_DAT_005d3f90 == 0) {
    uVar3 = getpid();
    pFVar4 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator->((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                         *)&local_98);
    __val = -uVar3;
    if (0 < (int)uVar3) {
      __val = uVar3;
    }
    __len = 1;
    if (9 < __val) {
      uVar6 = (ulong)__val;
      uVar1 = 4;
      do {
        __len = uVar1;
        uVar5 = (uint)uVar6;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_00473d72;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_00473d72;
        }
        if (uVar5 < 10000) goto LAB_00473d72;
        uVar6 = uVar6 / 10000;
        uVar1 = __len + 4;
      } while (99999 < uVar5);
      __len = __len + 1;
    }
LAB_00473d72:
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct((ulong)local_90,(char)__len - (char)((int)uVar3 >> 0x1f));
    Catch::clara::std::__detail::__to_chars_10_impl<unsigned_int>
              (local_90[0] + (uVar3 >> 0x1f),__len,__val);
    duckdb::FileSystem::JoinPath((string *)local_50,(string *)pFVar4);
    std::__cxx11::string::operator=((string *)in_RDI,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)in_RDI);
  }
  pFVar4 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator->
                     ((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                       *)&local_98);
  cVar2 = (**(code **)(*(long *)pFVar4 + 0x68))(pFVar4);
  if (cVar2 == '\0') {
    pFVar4 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator->((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                         *)&local_98);
    (**(code **)(*(long *)pFVar4 + 0x70))(pFVar4);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_98._M_head_impl != (FileSystem *)0x0) {
    (**(code **)(*(long *)local_98._M_head_impl + 8))();
  }
  return in_RDI;
}

Assistant:

string TestDirectoryPath() {
	duckdb::unique_ptr<FileSystem> fs = FileSystem::CreateLocal();
	auto test_directory = GetTestDirectory();
	if (!fs->DirectoryExists(test_directory)) {
		fs->CreateDirectory(test_directory);
	}
	string path;
	if (custom_test_directory.empty()) {
		// add the PID to the test directory - but only if it was not specified explicitly by the user
		auto pid = getpid();
		path = fs->JoinPath(test_directory, to_string(pid));
	} else {
		path = test_directory;
	}
	if (!fs->DirectoryExists(path)) {
		fs->CreateDirectory(path);
	}
	return path;
}